

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoxList.h
# Opt level: O0

Iterator __thiscall
axl::sl::BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&>::insertTail
          (BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&> *this,Ptr<void> *value)

{
  Iterator IVar1;
  Ptr<void> *in_RDI;
  Entry *entry;
  Ptr<void> *in_stack_ffffffffffffffb8;
  
  operator_new(0x20);
  BoxListEntry<axl::rc::Ptr<void>_>::BoxListEntry((BoxListEntry<axl::rc::Ptr<void>_> *)0x13eed2);
  rc::Ptr<void>::operator=(in_RDI,in_stack_ffffffffffffffb8);
  IVar1 = insertTailEntry((BoxList<axl::rc::Ptr<void>,_const_axl::rc::Ptr<void>_&> *)
                          in_stack_ffffffffffffffb8,(Entry *)0x13ef00);
  return (BoxIteratorImpl<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::rc::Ptr<void>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>
          )IVar1.
           super_BoxIteratorImpl<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::rc::Ptr<void>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink>
           .
           super_IteratorBase<axl::sl::BoxIterator<axl::rc::Ptr<void>_>,_axl::sl::BoxListEntry<axl::rc::Ptr<void>_>,_axl::sl::ListLink,_axl::sl::ImplicitCast<axl::sl::BoxListEntry<axl::rc::Ptr<void>_>_*,_axl::sl::ListLink_*>_>
           .m_p;
}

Assistant:

Iterator
	insertTail(ValueArg value) {
		Entry* entry = new Entry;
		entry->m_value = value;
		return insertTailEntry(entry);
	}